

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdevice_p.h
# Opt level: O1

void __thiscall QInputDevicePrivate::setAvailableVirtualGeometry(QInputDevicePrivate *this,QRect a)

{
  uint uVar1;
  QRect QVar2;
  
  if ((((*(int *)(this + 0xc0) == a.x1.m_i.m_i) && (*(int *)(this + 200) == a.x2.m_i.m_i)) &&
      (*(int *)(this + 0xc4) == a.y1.m_i.m_i)) && (*(int *)(this + 0xcc) == a.y2.m_i.m_i)) {
    return;
  }
  *(long *)(this + 0xc0) = a._0_8_;
  *(long *)(this + 200) = a._8_8_;
  uVar1 = *(uint *)(this + 0xe0) | 0x20;
  if (*(uint *)(this + 0xe0) != uVar1) {
    *(uint *)(this + 0xe0) = uVar1;
    QInputDevice::capabilitiesChanged(*(undefined8 *)(this + 8));
  }
  QVar2._8_8_ = *(undefined8 *)(this + 0xc0);
  QVar2._0_8_ = *(undefined8 *)(this + 8);
  QInputDevice::availableVirtualGeometryChanged(QVar2);
  return;
}

Assistant:

void setAvailableVirtualGeometry(QRect a)
    {
        if (a == availableVirtualGeometry)
            return;

        availableVirtualGeometry = a;
        setCapabilities(capabilities | QInputDevice::Capability::NormalizedPosition);
        Q_Q(QInputDevice);
        Q_EMIT q->availableVirtualGeometryChanged(availableVirtualGeometry);
    }